

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
V2Transport::V2Transport
          (V2Transport *this,NodeId nodeid,bool initiating,CKey *key,Span<const_std::byte> ent32,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *garbage)

{
  long lVar1;
  Span<const_std::byte> ent32_00;
  byte bVar2;
  char *in_RCX;
  byte in_DL;
  AnnotatedMixin<std::mutex> *in_RSI;
  V1Transport *in_RDI;
  V2Transport *in_R8;
  long in_FS_OFFSET;
  BIP324Cipher *in_stack_00000008;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock43;
  Mutex *in_stack_ffffffffffffff78;
  CKey *in_stack_ffffffffffffff80;
  int line;
  CHash256 *val;
  undefined7 in_stack_ffffffffffffffa8;
  V1Transport *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  this_00 = in_RDI;
  Transport::Transport((Transport *)in_stack_ffffffffffffff78);
  ((_Alloc_hider *)&in_RDI->super_Transport)->_M_p = (pointer)&PTR__V2Transport_0160ef50;
  ent32_00.m_size._0_7_ = in_stack_ffffffffffffffa8;
  ent32_00.m_data = (byte *)in_RCX;
  ent32_00.m_size._7_1_ = bVar2;
  BIP324Cipher::BIP324Cipher(in_stack_00000008,in_stack_ffffffffffffff80,ent32_00);
  line = (int)((ulong)in_stack_00000008 >> 0x20);
  *(byte *)&in_RDI[1].vRecv.m_read_pos = bVar2 & 1;
  *(AnnotatedMixin<std::mutex> **)&in_RDI[1].nHdrPos = in_RSI;
  V1Transport::V1Transport(this_00,(NodeId)in_RSI);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff78);
  *(undefined4 *)
   &in_RDI[2].m_header_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78);
  in_RDI[2].m_sending_header = (bool)(bVar2 & 1);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78);
  *(undefined4 *)((long)&in_RDI[3].m_recv_mutex.super_mutex.super___mutex_base._M_mutex + 0x20) = 0;
  val = &in_RDI[3].hasher;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2091bd);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  in_RDI[3].hasher.sha.buf[0x18] = bVar2 & 1;
  in_RDI[3].hasher.sha.buf[0x19] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78);
  inline_assertion_check<false,bool>
            ((bool *)val,(char *)in_RDI,line,&in_stack_ffffffffffffff80->fCompressed,
             (char *)in_stack_ffffffffffffff78);
  if ((bVar2 & 1) != 0) {
    MaybeCheckNotHeld(in_stack_ffffffffffffff78);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_00,in_RSI,
               (char *)CONCAT17(bVar2,in_stack_ffffffffffffffa8),in_RCX,(int)((ulong)val >> 0x20),
               SUB81((ulong)val >> 0x18,0));
    StartSendingHandshake(in_R8);
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

V2Transport::V2Transport(NodeId nodeid, bool initiating, const CKey& key, Span<const std::byte> ent32, std::vector<uint8_t> garbage) noexcept
    : m_cipher{key, ent32}, m_initiating{initiating}, m_nodeid{nodeid},
      m_v1_fallback{nodeid},
      m_recv_state{initiating ? RecvState::KEY : RecvState::KEY_MAYBE_V1},
      m_send_garbage{std::move(garbage)},
      m_send_state{initiating ? SendState::AWAITING_KEY : SendState::MAYBE_V1}
{
    Assume(m_send_garbage.size() <= MAX_GARBAGE_LEN);
    // Start sending immediately if we're the initiator of the connection.
    if (initiating) {
        LOCK(m_send_mutex);
        StartSendingHandshake();
    }
}